

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O2

void __thiscall CAMFImporter_NodeElement::~CAMFImporter_NodeElement(CAMFImporter_NodeElement *this)

{
  this->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_007a14c8;
  std::__cxx11::_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
  ::_M_clear(&(this->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            );
  std::__cxx11::string::~string((string *)&this->ID);
  return;
}

Assistant:

virtual ~CAMFImporter_NodeElement() {
        // empty
    }